

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmp_test.cpp
# Opt level: O0

void __thiscall diff_match_patch_test::testPatchObj(diff_match_patch_test *this)

{
  wstring local_460;
  allocator<wchar_t> local_439;
  wstring local_438;
  allocator<wchar_t> local_411;
  undefined1 local_410 [8];
  wstring strp;
  wstring local_3e8 [32];
  Diff local_3c8;
  allocator<wchar_t> local_399;
  wstring local_398 [32];
  Diff local_378;
  allocator<wchar_t> local_349;
  wstring local_348 [32];
  Diff local_328;
  allocator<wchar_t> local_2f9;
  wstring local_2f8 [32];
  Diff local_2d8;
  allocator<wchar_t> local_2a9;
  wstring local_2a8 [32];
  Diff local_288;
  allocator<wchar_t> local_259;
  wstring local_258 [32];
  Diff local_238;
  allocator<wchar_t> local_209;
  wstring local_208 [32];
  Diff local_1e8;
  allocator<wchar_t> local_1b9;
  wstring local_1b8 [32];
  Diff local_198;
  allocator<wchar_t> local_169;
  wstring local_168 [32];
  Diff local_148;
  allocator<wchar_t> local_109;
  wstring local_108 [32];
  Diff local_e8;
  deque<Diff,_std::allocator<Diff>_> local_c0;
  undefined1 local_70 [8];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> p;
  diff_match_patch_test *this_local;
  
  Patch::Patch((Patch *)local_70);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_108,L"jump",&local_109);
  Diff::Diff(&local_e8,Equal,local_108);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_168,L"s",&local_169);
  Diff::Diff(&local_148,Delete,local_168);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_1b8,L"ed",&local_1b9);
  Diff::Diff(&local_198,Insert,local_1b8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_208,L" over ",&local_209);
  Diff::Diff(&local_1e8,Equal,local_208);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_258,L"the",&local_259);
  Diff::Diff(&local_238,Delete,local_258);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2a8,L"a",&local_2a9);
  Diff::Diff(&local_288,Insert,local_2a8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_2f8,L"\nlaz",&local_2f9);
  Diff::Diff(&local_2d8,Equal,local_2f8);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_348,L"",&local_349);
  Diff::Diff(&local_328,Insert,local_348);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>(local_398,L"",&local_399);
  Diff::Diff(&local_378,Insert,local_398);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            (local_3e8,L"",(allocator<wchar_t> *)((long)&strp.field_2 + 0xf));
  Diff::Diff(&local_3c8,Insert,local_3e8);
  diffList(&local_c0,this,&local_e8,&local_148,&local_198,&local_1e8,&local_238,&local_288,
           &local_2d8,&local_328,&local_378,&local_3c8);
  std::deque<Diff,_std::allocator<Diff>_>::operator=
            ((deque<Diff,_std::allocator<Diff>_> *)local_70,&local_c0);
  std::deque<Diff,_std::allocator<Diff>_>::~deque(&local_c0);
  Diff::~Diff(&local_3c8);
  std::__cxx11::wstring::~wstring(local_3e8);
  std::allocator<wchar_t>::~allocator((allocator<wchar_t> *)((long)&strp.field_2 + 0xf));
  Diff::~Diff(&local_378);
  std::__cxx11::wstring::~wstring(local_398);
  std::allocator<wchar_t>::~allocator(&local_399);
  Diff::~Diff(&local_328);
  std::__cxx11::wstring::~wstring(local_348);
  std::allocator<wchar_t>::~allocator(&local_349);
  Diff::~Diff(&local_2d8);
  std::__cxx11::wstring::~wstring(local_2f8);
  std::allocator<wchar_t>::~allocator(&local_2f9);
  Diff::~Diff(&local_288);
  std::__cxx11::wstring::~wstring(local_2a8);
  std::allocator<wchar_t>::~allocator(&local_2a9);
  Diff::~Diff(&local_238);
  std::__cxx11::wstring::~wstring(local_258);
  std::allocator<wchar_t>::~allocator(&local_259);
  Diff::~Diff(&local_1e8);
  std::__cxx11::wstring::~wstring(local_208);
  std::allocator<wchar_t>::~allocator(&local_209);
  Diff::~Diff(&local_198);
  std::__cxx11::wstring::~wstring(local_1b8);
  std::allocator<wchar_t>::~allocator(&local_1b9);
  Diff::~Diff(&local_148);
  std::__cxx11::wstring::~wstring(local_168);
  std::allocator<wchar_t>::~allocator(&local_169);
  Diff::~Diff(&local_e8);
  std::__cxx11::wstring::~wstring(local_108);
  std::allocator<wchar_t>::~allocator(&local_109);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)local_410,
             L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n",&local_411);
  std::allocator<wchar_t>::~allocator(&local_411);
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::allocator<wchar_t>>
            ((wstring *)&local_438,L"Patch: toString.",&local_439);
  Patch::toString_abi_cxx11_();
  assertEquals(this,&local_438,(wstring *)local_410,&local_460);
  std::__cxx11::wstring::~wstring((wstring *)&local_460);
  std::__cxx11::wstring::~wstring((wstring *)&local_438);
  std::allocator<wchar_t>::~allocator(&local_439);
  std::__cxx11::wstring::~wstring((wstring *)local_410);
  Patch::~Patch((Patch *)local_70);
  return;
}

Assistant:

void diff_match_patch_test::testPatchObj() {
  // Patch Object.
  Patch p;
  p.start1 = 20;
  p.start2 = 21;
  p.length1 = 18;
  p.length2 = 17;
  p.diffs = diffList(Diff(Diff::Operation::Equal, L"jump"), Diff(Diff::Operation::Delete, L"s"), Diff(Diff::Operation::Insert, L"ed"), Diff(Diff::Operation::Equal, L" over "), Diff(Diff::Operation::Delete, L"the"), Diff(Diff::Operation::Insert, L"a"), Diff(Diff::Operation::Equal, L"\nlaz"));
  std::wstring strp = L"@@ -21,18 +22,17 @@\n jump\n-s\n+ed\n  over \n-the\n+a\n %0Alaz\n";
  assertEquals(L"Patch: toString.", strp, p.toString());
}